

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_bool lzma_index_iter_locate(lzma_index_iter *iter,lzma_vli target)

{
  long lVar1;
  long *plVar2;
  void *pvVar3;
  lzma_index *plVar4;
  size_t pos;
  lzma_index *i;
  size_t right;
  size_t left;
  index_group *group;
  index_stream *stream;
  lzma_vli target_local;
  lzma_index_iter *iter_local;
  
  if (target < ((index_tree *)iter->internal[0].p)[1].root) {
    plVar2 = (long *)index_tree_locate((index_tree *)iter->internal[0].p,target);
    if (plVar2 == (long *)0x0) {
      __assert_fail("stream != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4de,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    lVar1 = *plVar2;
    pvVar3 = index_tree_locate((index_tree *)(plVar2 + 7),target - lVar1);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("group != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4e3,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    right = 0;
    plVar4 = *(lzma_index **)((long)pvVar3 + 0x38);
    while (i = plVar4, right < i) {
      plVar4 = (lzma_index *)(right + ((long)i - right >> 1));
      if (*(ulong *)((long)pvVar3 + (long)plVar4 * 0x10 + 0x40) <= target - lVar1) {
        right = (long)&(plVar4->streams).root + 1;
        plVar4 = i;
      }
    }
    iter->internal[1].p = plVar2;
    iter->internal[2].p = pvVar3;
    iter->internal[3].s = right;
    iter_set_info(iter);
    iter_local._7_1_ = '\0';
  }
  else {
    iter_local._7_1_ = '\x01';
  }
  return iter_local._7_1_;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_locate(lzma_index_iter *iter, lzma_vli target)
{
	const index_stream *stream;
	const index_group *group;
	size_t left, right;

	const lzma_index *i = iter->internal[ITER_INDEX].p;

	// If the target is past the end of the file, return immediately.
	if (i->uncompressed_size <= target)
		return true;

	// Locate the Stream containing the target offset.
	stream = index_tree_locate(&i->streams, target);
	assert(stream != NULL);
	target -= stream->node.uncompressed_base;

	// Locate the group containing the target offset.
	group = index_tree_locate(&stream->groups, target);
	assert(group != NULL);

	// Use binary search to locate the exact Record. It is the first
	// Record whose uncompressed_sum is greater than target.
	// This is because we want the rightmost Record that fullfills the
	// search criterion. It is possible that there are empty Blocks;
	// we don't want to return them.
	left = 0;
	right = group->last;

	while (left < right) {
		const size_t pos = left + (right - left) / 2;
		if (group->records[pos].uncompressed_sum <= target)
			left = pos + 1;
		else
			right = pos;
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = left;

	iter_set_info(iter);

	return false;
}